

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack2_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 3;
  out[1] = *in >> 2 & 3;
  out[2] = *in >> 4 & 3;
  out[3] = *in >> 6 & 3;
  out[4] = *in >> 8 & 3;
  out[5] = *in >> 10 & 3;
  out[6] = *in >> 0xc & 3;
  out[7] = *in >> 0xe & 3;
  out[8] = *in >> 0x10 & 3;
  out[9] = *in >> 0x12 & 3;
  out[10] = *in >> 0x14 & 3;
  out[0xb] = *in >> 0x16 & 3;
  out[0xc] = *in >> 0x18 & 3;
  out[0xd] = *in >> 0x1a & 3;
  out[0xe] = *in >> 0x1c & 3;
  out[0xf] = *in >> 0x1e;
  puVar1 = in + 1;
  out[0x10] = *puVar1 & 3;
  out[0x11] = *puVar1 >> 2 & 3;
  out[0x12] = *puVar1 >> 4 & 3;
  out[0x13] = *puVar1 >> 6 & 3;
  out[0x14] = *puVar1 >> 8 & 3;
  out[0x15] = *puVar1 >> 10 & 3;
  out[0x16] = *puVar1 >> 0xc & 3;
  out[0x17] = *puVar1 >> 0xe & 3;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack2_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 2);
  out++;
  *out = ((*in) >> 2) % (1U << 2);
  out++;
  *out = ((*in) >> 4) % (1U << 2);
  out++;
  *out = ((*in) >> 6) % (1U << 2);
  out++;
  *out = ((*in) >> 8) % (1U << 2);
  out++;
  *out = ((*in) >> 10) % (1U << 2);
  out++;
  *out = ((*in) >> 12) % (1U << 2);
  out++;
  *out = ((*in) >> 14) % (1U << 2);
  out++;
  *out = ((*in) >> 16) % (1U << 2);
  out++;
  *out = ((*in) >> 18) % (1U << 2);
  out++;
  *out = ((*in) >> 20) % (1U << 2);
  out++;
  *out = ((*in) >> 22) % (1U << 2);
  out++;
  *out = ((*in) >> 24) % (1U << 2);
  out++;
  *out = ((*in) >> 26) % (1U << 2);
  out++;
  *out = ((*in) >> 28) % (1U << 2);
  out++;
  *out = ((*in) >> 30);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 2);
  out++;
  *out = ((*in) >> 2) % (1U << 2);
  out++;
  *out = ((*in) >> 4) % (1U << 2);
  out++;
  *out = ((*in) >> 6) % (1U << 2);
  out++;
  *out = ((*in) >> 8) % (1U << 2);
  out++;
  *out = ((*in) >> 10) % (1U << 2);
  out++;
  *out = ((*in) >> 12) % (1U << 2);
  out++;
  *out = ((*in) >> 14) % (1U << 2);
  out++;

  return in + 1;
}